

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O3

byte_vec_t * __thiscall sfc::Map::gbc_banked_data(byte_vec_t *__return_storage_ptr__,Map *this)

{
  ulong uVar1;
  runtime_error *this_00;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  byte_vec_t linear_data;
  allocator_type local_29;
  byte_vec_t local_28;
  
  if (((this->_map_width & 0x1f) == 0) && ((this->_map_height & 0x1f) == 0)) {
    native_data(&local_28,this,false,0,0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,
               (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,&local_29);
    if (1 < (ulong)((long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start)) {
      uVar2 = 0;
      uVar3 = 1;
      uVar5 = 0;
      do {
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[uVar5] =
             local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start[uVar2];
        uVar5 = (ulong)uVar3;
        uVar1 = (ulong)((long)local_28.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_28.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 1;
        uVar2 = (ulong)((int)uVar2 + 2);
        uVar3 = uVar3 + 1;
      } while (uVar5 < uVar1);
      if (1 < (ulong)((long)local_28.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_28.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start)) {
        uVar3 = 1;
        uVar2 = 0;
        uVar4 = 1;
        do {
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_start[uVar2 + uVar1] =
               local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4];
          uVar2 = (ulong)uVar3;
          uVar1 = (ulong)((long)local_28.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_28.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 1;
          uVar4 = uVar4 + 2;
          uVar3 = uVar3 + 1;
        } while (uVar2 < uVar1);
      }
    }
    if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_28.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_28.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"gbc/out-gbc-bank requires map dimensions to be multiples of 32");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

byte_vec_t Map::gbc_banked_data() const {
  if ((width() % 32) || (height() % 32))
    throw std::runtime_error("gbc/out-gbc-bank requires map dimensions to be multiples of 32");

  const auto linear_data = native_data();
  auto banked_data = byte_vec_t(linear_data.size());
  for (unsigned i = 0; i < linear_data.size() >> 1; ++i) banked_data[i] = linear_data[i << 1];
  for (unsigned i = 0; i < linear_data.size() >> 1; ++i) banked_data[i + (linear_data.size() >> 1)] = linear_data[(i << 1) + 1];
  return banked_data;
}